

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

uint32_t ra_portable_header_size(roaring_array_t *ra)

{
  _Bool _Var1;
  int *in_RDI;
  roaring_array_t *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  _Var1 = ra_has_run_container(in_stack_ffffffffffffffe8);
  if (_Var1) {
    if (*in_RDI < 4) {
      local_4 = (*in_RDI + 7) / 8 + 4 + *in_RDI * 4;
    }
    else {
      local_4 = (*in_RDI + 7) / 8 + 4 + *in_RDI * 8;
    }
  }
  else {
    local_4 = *in_RDI * 8 + 8;
  }
  return local_4;
}

Assistant:

uint32_t ra_portable_header_size(const roaring_array_t *ra) {
    if (ra_has_run_container(ra)) {
        if (ra->size <
            NO_OFFSET_THRESHOLD) {  // for small bitmaps, we omit the offsets
            return 4 + (ra->size + 7) / 8 + 4 * ra->size;
        }
        return 4 + (ra->size + 7) / 8 +
               8 * ra->size;  // - 4 because we pack the size with the cookie
    } else {
        return 4 + 4 + 8 * ra->size;
    }
}